

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O2

Vertex __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::insertVertex(ManifoldSurfaceMesh *this,Face fIn)

{
  uint64_t *puVar1;
  unsigned_long uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  unsigned_long uVar7;
  long lVar8;
  unsigned_long uVar9;
  ParentMeshT *pPVar10;
  size_t __n;
  ParentMeshT *pPVar11;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar18;
  Halfedge HVar19;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  faceBoundaryHalfedges;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> innerFaces
  ;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  trailingHalfedges;
  Face fIn_local;
  vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> innerEdges
  ;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  leadingHalfedges;
  Halfedge he;
  
  fIn_local.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
       = fIn.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         ind;
  fIn_local.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
  mesh = fIn.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         mesh;
  EVar18 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
           SurfaceMesh::getNewVertex(&this->super_SurfaceMesh);
  __n = Face::degree(&fIn_local);
  innerFaces.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  innerFaces.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  innerFaces.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector(&leadingHalfedges,__n,(allocator_type *)&trailingHalfedges);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector(&trailingHalfedges,__n,(allocator_type *)&innerEdges);
  ::std::vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>::
  vector(&innerEdges,__n,(allocator_type *)&faceBoundaryHalfedges);
  lVar16 = 8;
  for (uVar15 = 1;
      pPVar10 = fIn_local.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .mesh, uVar15 - __n != 1; uVar15 = uVar15 + 1) {
    if (uVar15 == 1) {
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::push_back(&innerFaces,&fIn_local);
    }
    else {
      faceBoundaryHalfedges.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._0_16_ = SurfaceMesh::getNewFace(&this->super_SurfaceMesh);
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::emplace_back<geometrycentral::surface::Face>(&innerFaces,(Face *)&faceBoundaryHalfedges);
    }
    HVar19 = SurfaceMesh::getNewEdgeTriple(&this->super_SurfaceMesh,false);
    uVar13 = HVar19.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .ind;
    pPVar11 = HVar19.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh;
    *(ParentMeshT **)
     ((long)leadingHalfedges.
            super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) = pPVar11;
    *(ulong *)((long)&((leadingHalfedges.
                        super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      ).mesh + lVar16) = uVar13;
    if (pPVar11->useImplicitTwinFlag == true) {
      uVar14 = uVar13 ^ 1;
    }
    else {
      uVar14 = (pPVar11->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
    }
    trailingHalfedges.
    super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15 % __n].
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar11;
    trailingHalfedges.
    super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15 % __n].
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar14;
    if (pPVar11->useImplicitTwinFlag == true) {
      uVar13 = uVar13 >> 1;
    }
    else {
      uVar13 = (pPVar11->heEdgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
    }
    *(ParentMeshT **)
     ((long)innerEdges.
            super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) = pPVar11;
    *(ulong *)((long)&((innerEdges.
                        super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                      ).mesh + lVar16) = uVar13;
    lVar16 = lVar16 + 0x10;
  }
  faceBoundaryHalfedges.
  super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  faceBoundaryHalfedges.
  super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar17 = true;
  uVar2 = ((fIn_local.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [fIn_local.
           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind]
  ;
  for (uVar12 = uVar2; (bVar17 || (uVar12 != uVar2));
      uVar12 = (pPVar10->heNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12]) {
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
         = pPVar10;
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
         = uVar12;
    ::std::
    vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
    ::push_back(&faceBoundaryHalfedges,&he);
    bVar17 = false;
  }
  puVar3 = (this->super_SurfaceMesh).fHalfedgeArr.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_SurfaceMesh).heNextArr.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_SurfaceMesh).heVertexArr.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->super_SurfaceMesh).heFaceArr.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = 8;
  while (bVar17 = __n != 0, __n = __n - 1, bVar17) {
    uVar2 = *(unsigned_long *)
             ((long)&((leadingHalfedges.
                       super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     ).mesh + lVar16);
    uVar12 = *(unsigned_long *)
              ((long)&((trailingHalfedges.
                        super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      ).mesh + lVar16);
    uVar7 = *(unsigned_long *)
             ((long)&((faceBoundaryHalfedges.
                       super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     ).mesh + lVar16);
    lVar8 = *(long *)((long)faceBoundaryHalfedges.
                            super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
    uVar9 = *(unsigned_long *)
             ((long)&((innerFaces.
                       super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                     ).mesh + lVar16);
    lVar16 = lVar16 + 0x10;
    puVar3[uVar9] = uVar7;
    puVar4[uVar2] = uVar12;
    puVar5[uVar2] =
         *(unsigned_long *)
          (*(long *)(lVar8 + 0x128) + *(long *)(*(long *)(lVar8 + 0x110) + uVar7 * 8) * 8);
    puVar6[uVar2] = uVar9;
    puVar4[uVar12] = uVar7;
    puVar5[uVar12] = EVar18.ind;
    puVar6[uVar12] = uVar9;
    puVar4[uVar7] = uVar2;
    puVar6[uVar7] = uVar9;
  }
  (this->super_SurfaceMesh).vHalfedgeArr.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start[EVar18.ind] =
       ((trailingHalfedges.
         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).ind
  ;
  puVar1 = &(this->super_SurfaceMesh).modificationTick;
  *puVar1 = *puVar1 + 1;
  ::std::
  _Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  ::~_Vector_base(&faceBoundaryHalfedges.
                   super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 );
  ::std::
  _Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>::
  ~_Vector_base(&innerEdges.
                 super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
               );
  ::std::
  _Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  ::~_Vector_base(&trailingHalfedges.
                   super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 );
  ::std::
  _Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  ::~_Vector_base(&leadingHalfedges.
                   super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 );
  ::std::
  _Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  ~_Vector_base(&innerFaces.
                 super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
               );
  return (Vertex)EVar18;
}

Assistant:

Vertex ManifoldSurfaceMesh::insertVertex(Face fIn) {

  // Create the new center vertex
  Vertex centerVert = getNewVertex();

  // Count degree to allocate elements
  size_t faceDegree = fIn.degree();

  // == Create new halfedges/edges/faces around the center vertex

  // Create all of the new elements first, then hook them up below
  std::vector<Face> innerFaces;
  std::vector<Halfedge> leadingHalfedges(faceDegree); // the one that points towards the center
  std::vector<Halfedge> trailingHalfedges(faceDegree);
  std::vector<Edge> innerEdges(faceDegree); // aligned with leading he
  for (size_t i = 0; i < faceDegree; i++) {
    // Re-use first face
    if (i == 0) {
      innerFaces.push_back(fIn);
    } else {
      innerFaces.push_back(getNewFace());
    }

    // Get the new edge group
    Halfedge newHe = getNewEdgeTriple(false);

    leadingHalfedges[i] = newHe;
    trailingHalfedges[(i + 1) % faceDegree] = newHe.twin();
    innerEdges[i] = newHe.edge();
  }

  // Form this list before we start, because we're about to start breaking pointers
  std::vector<Halfedge> faceBoundaryHalfedges;
  for (Halfedge he : fIn.adjacentHalfedges()) {
    faceBoundaryHalfedges.push_back(he);
  }

  // Connect up all the pointers
  // Each iteration processes one inner face
  for (size_t i = 0; i < faceDegree; i++) {

    // Gather pointers
    Face f = innerFaces[i];
    Edge e = innerEdges[i];
    Edge prevE = innerEdges[(i + faceDegree - 1) % faceDegree];
    Halfedge leadingHe = leadingHalfedges[i];
    Halfedge trailingHe = trailingHalfedges[i];
    Halfedge boundaryHe = faceBoundaryHalfedges[i];
    Halfedge nextTrailingHe = trailingHalfedges[(i + 1) % faceDegree];
    Halfedge prevLeadingHe = leadingHalfedges[(i + faceDegree - 1) % faceDegree];

    // face
    fHalfedgeArr[f.getIndex()] = boundaryHe.getIndex();

    // leading halfedge
    heNextArr[leadingHe.getIndex()] = trailingHe.getIndex();
    heVertexArr[leadingHe.getIndex()] = boundaryHe.next().vertex().getIndex();
    heFaceArr[leadingHe.getIndex()] = f.getIndex();

    // trailing halfedge
    heNextArr[trailingHe.getIndex()] = boundaryHe.getIndex();
    heVertexArr[trailingHe.getIndex()] = centerVert.getIndex();
    heFaceArr[trailingHe.getIndex()] = f.getIndex();

    // boundary halfedge
    heNextArr[boundaryHe.getIndex()] = leadingHe.getIndex();
    heFaceArr[boundaryHe.getIndex()] = f.getIndex();
  }

  vHalfedgeArr[centerVert.getIndex()] = trailingHalfedges[0].getIndex();

  modificationTick++;
  return centerVert;
}